

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node.cpp
# Opt level: O0

fe_im * get_image(fe_im *__return_storage_ptr__,fe_node *node,fe_args *args)

{
  fe_im_cache *pfVar1;
  fe_im *res;
  fe_im_cache *cached;
  fe_args *args_local;
  fe_node *node_local;
  
  pfVar1 = (args->cache).images;
  if ((pfVar1 == (fe_im_cache *)0x0) || (pfVar1[node->index].image.image.data == (uint8_t *)0x0)) {
    (*node->get_image)(__return_storage_ptr__,node,args);
    __return_storage_ptr__->x = (int)((float)node->x * args->scale) + __return_storage_ptr__->x;
    __return_storage_ptr__->y = (int)((float)node->y * args->scale) + __return_storage_ptr__->y;
    if (pfVar1 != (fe_im_cache *)0x0) {
      memcpy(pfVar1 + node->index,__return_storage_ptr__,0x30);
      (__return_storage_ptr__->image).free = (free_image_fn)0x0;
    }
  }
  else {
    memcpy(__return_storage_ptr__,pfVar1 + node->index,0x30);
    (__return_storage_ptr__->image).free = (free_image_fn)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

fe_im get_image(const fe_node* node, const fe_args* args)
{
    fe_im_cache *cached = args->cache.images;
    if (cached && cached[node->index].image.image.data)
    {
        fe_im res = cached[node->index].image;
        res.image.free = 0;
        return res;
    }
    

    fe_im r = node->get_image(node, args);

    r.x += static_cast<int>(node->x * args->scale);
    r.y += static_cast<int>(node->y * args->scale);

#ifdef SAVE_NODES
    char str[255];
    sprintf(str, "../temp/%d.tga", node->id);
    fe_image_save_tga(&r.image, str);
#endif

    if (cached)
    {
        cached[node->index].image = r;
        r.image.free = 0;
    }

    return r;
}